

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::Simple16<true>::decodeArray
          (Simple16<true> *this,uint32_t *in,size_t param_3,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint32_t uVar2;
  size_t req;
  ulong uVar3;
  ulong in_RCX;
  uint *in_RSI;
  ulong *in_R8;
  uint32_t *end;
  uint32_t actualvalue;
  NotEnoughStorage *in_stack_ffffffffffffffc0;
  ulong local_20 [2];
  uint *local_10 [2];
  
  if (*in_R8 < (ulong)*in_RSI) {
    req = __cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(in_stack_ffffffffffffffc0,req);
    __cxa_throw(req,&NotEnoughStorage::typeinfo,NotEnoughStorage::~NotEnoughStorage);
  }
  local_10[0] = in_RSI + 1;
  uVar1 = *in_RSI;
  local_20[0] = in_RCX;
  if (*in_R8 < (ulong)uVar1) {
    fprintf(_stderr,"possible overrun\n");
  }
  *in_R8 = (ulong)uVar1;
  uVar3 = local_20[0] + *in_R8 * 4;
  while (local_20[0] < uVar3) {
    uVar2 = which(local_10[0]);
    (**(code **)(unpackarray + (ulong)uVar2 * 8))(local_20,local_10);
  }
  return local_10[0];
}

Assistant:

const uint32_t *Simple16<MarkLength>::decodeArray(const uint32_t *in,
#ifndef NDEBUG
                                                  const size_t len,
                                                  uint32_t *out,
                                                  size_t &nvalue) {
#else
                                                  const size_t, uint32_t *out,
                                                  size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const endin = in + len;
#endif
  if (MarkLength)
    if ((*in) > nvalue)
      throw NotEnoughStorage(*in);
  const uint32_t actualvalue =
      MarkLength ? *(in++) : static_cast<uint32_t>(nvalue);
  if (nvalue < actualvalue)
    fprintf(stderr, "possible overrun\n");
  nvalue = actualvalue;
#ifdef STATS
  printf("simple16 decode %zu\n", len);
  std::vector<uint32_t> stats(16, 0);
#endif
  const uint32_t *const end = out + nvalue;
  while (end > out) {
#ifdef STATS
    stats[which(in)]++;
#endif
    (unpackarray[which(in)])(&out, &in);
  }

#ifdef STATS
  uint32_t sum = std::accumulate(stats.begin(), stats.end(), 0);
  for (uint32_t k = 0; k < stats.size(); ++k) {
    printf("simple16 stats[%u]=%f\n", k, stats[k] * 1.0 / sum);
  }
#endif
  ASSERT(in <= endin, std::to_string(in - endin));
  return in;
}